

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
ready_to_deregister_notify
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this,coop_t *coop)

{
  iterator *piVar1;
  _Elt_pointer ppcVar2;
  int iVar3;
  coop_t *local_18;
  
  local_18 = coop;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_sync_objects);
  if (iVar3 == 0) {
    ppcVar2 = (this->m_final_dereg_coops).
              super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppcVar2 ==
        (this->m_final_dereg_coops).
        super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<so_5::coop_t*,std::allocator<so_5::coop_t*>>::_M_push_back_aux<so_5::coop_t*const&>
                ((deque<so_5::coop_t*,std::allocator<so_5::coop_t*>> *)&this->m_final_dereg_coops,
                 &local_18);
    }
    else {
      *ppcVar2 = local_18;
      piVar1 = &(this->m_final_dereg_coops).
                super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    if ((this->m_sync_objects).m_status == waiting) {
      std::condition_variable::notify_one();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_sync_objects);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::ready_to_deregister_notify(
	coop_t * coop )
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );
		m_final_dereg_coops.push_back( coop );

		wakeup_if_waiting( m_sync_objects );
	}